

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJs.cpp
# Opt level: O3

bool Js::AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler *m)

{
  uint size;
  AsmJSParser *ppPVar1;
  code *pcVar2;
  bool bVar3;
  OpCode OVar4;
  undefined4 *puVar5;
  ParseNodeBin *pPVar6;
  ParseNodeVar *pPVar7;
  ParseNodeArrLit *pPVar8;
  PropertyName name;
  AsmJsSymbol *pAVar9;
  char16_t *fmt;
  ParseNode *this;
  ParseNode *this_00;
  int32 iVar10;
  ParseNodePtr this_01;
  
  ppPVar1 = m->mCurrentParserNode;
  this_01 = *ppPVar1;
  if (this_01->nop != knopList) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                ,0x2df,"(list->nop == knopList)","list->nop == knopList");
    if (!bVar3) {
LAB_00931a2b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    this_01 = *ppPVar1;
    iVar10 = 0;
    if (this_01->nop == knopEndCode) goto LAB_009319c6;
  }
  iVar10 = 0;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    pPVar6 = ParseNode::AsParseNodeBin(this_01);
    this = pPVar6->pnode1;
    if (((1 < (byte)(this->nop + ~knopList)) ||
        (pPVar7 = ParseNode::AsParseNodeVar(this), pPVar7->pnodeInit == (ParseNodePtr)0x0)) ||
       (pPVar7 = ParseNode::AsParseNodeVar(this), pPVar7->pnodeInit->nop != knopArray)) break;
    pPVar7 = ParseNode::AsParseNodeVar(this);
    pPVar8 = ParseNode::AsParseNodeArrLit(pPVar7->pnodeInit);
    size = pPVar8->count;
    name = ParseNode::name(this);
    if (((int)size < 1) || ((size + 0x7fffffff & size) != 0)) {
      fmt = L"Function table [%s] size must be a power of 2";
LAB_009319fe:
      bVar3 = AsmJsModuleCompiler::FailName(m,this,fmt,name);
      return bVar3;
    }
    bVar3 = AsmJsModuleCompiler::AddFunctionTable(m,name,size);
    name = ParseNode::name(this);
    if (!bVar3) {
      fmt = L"Unable to create new function table %s";
      goto LAB_009319fe;
    }
    pAVar9 = AsmJsModuleCompiler::LookupIdentifier(m,name,(AsmJsFunc *)0x0,(Source *)0x0);
    if (pAVar9 == (AsmJsSymbol *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJs.cpp"
                                  ,0x2f8,"(ftable)","ftable");
      if (!bVar3) goto LAB_00931a2b;
      *puVar5 = 0;
    }
    pPVar7 = ParseNode::AsParseNodeVar(this);
    pPVar8 = ParseNode::AsParseNodeArrLit(pPVar7->pnodeInit);
    this_00 = (pPVar8->super_ParseNodeUni).pnode1;
    OVar4 = this_00->nop;
    if (OVar4 == knopList) {
      pPVar6 = ParseNode::AsParseNodeBin(this_00);
      this_00 = pPVar6->pnode1;
      OVar4 = this_00->nop;
    }
    if ((OVar4 != knopName) && (OVar4 != knopStr)) {
      name = ParseNode::name(this);
      fmt = L"Invalid element in function table %s";
      this = this_00;
      goto LAB_009319fe;
    }
    iVar10 = iVar10 + 1;
    pPVar6 = ParseNode::AsParseNodeBin(*ppPVar1);
    this_01 = pPVar6->pnode2;
    *ppPVar1 = this_01;
  } while (this_01->nop != knopEndCode);
  this_01 = *ppPVar1;
LAB_009319c6:
  m->mFuncPtrTableCount = iVar10;
  *m->mCurrentParserNode = this_01;
  return true;
}

Assistant:

bool AsmJSCompiler::CheckFunctionTables(AsmJsModuleCompiler &m)
    {
        AsmJSParser& list = m.GetCurrentParserNode();
        Assert(list->nop == knopList);

        int32 funcPtrTableCount = 0;
        while (list->nop != knopEndCode)
        {
            ParseNode * varStmt = ParserWrapper::GetBinaryLeft(list);
            if (varStmt->nop != knopConstDecl && varStmt->nop != knopVarDecl)
            {
                break;
            }
            if (!varStmt->AsParseNodeVar()->pnodeInit || varStmt->AsParseNodeVar()->pnodeInit->nop != knopArray)
            {
                break;
            }
            const uint tableSize = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->count;
            if (!::Math::IsPow2(tableSize))
            {
                return m.FailName(varStmt, _u("Function table [%s] size must be a power of 2"), varStmt->name());
            }
            if (!m.AddFunctionTable(varStmt->name(), tableSize))
            {
                return m.FailName(varStmt, _u("Unable to create new function table %s"), varStmt->name());
            }

            AsmJsFunctionTable* ftable = (AsmJsFunctionTable*)m.LookupIdentifier(varStmt->name());
            Assert(ftable);
            ParseNode* pnode = varStmt->AsParseNodeVar()->pnodeInit->AsParseNodeArrLit()->pnode1;
            if (pnode->nop == knopList)
            {
                pnode = ParserWrapper::GetBinaryLeft(pnode);
            }
            if (!ParserWrapper::IsNameDeclaration(pnode))
            {
                return m.FailName(pnode, _u("Invalid element in function table %s"), varStmt->name());
            }
            ++funcPtrTableCount;
            list = ParserWrapper::GetBinaryRight(list);
        }

        m.SetFuncPtrTableCount(funcPtrTableCount);

        m.SetCurrentParseNode(list);
        return true;
    }